

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O2

void zmToMont(octet *b,word *a,qr_o *r,void *stack)

{
  size_t n;
  
  n = r->n;
  wwCopy((word *)stack,a,n);
  wwSetZero((word *)((long)stack + r->n * 8),r->n);
  zzRedMont((word *)stack,r->mod,r->n,*r->params,(void *)(n * 0x10 + (long)stack));
  u64To(b,r->no,(u64 *)stack);
  return;
}

Assistant:

static void zmToMont(octet b[], const word a[], const qr_o* r, void* stack)
{
	word* c = (word*)stack;
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(a, r));
	stack = c + 2 * r->n;
	// c <- a * R^{-1} \mod mod
	wwCopy(c, a, r->n);
	wwSetZero(c + r->n, r->n);
	zzRedMont(c, r->mod, r->n, *(word*)r->params, stack);
	// b <- c
	wwTo(b, r->no, c);
}